

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O3

void itrans_dct2_h4_w16_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 (*pauVar6) [32];
  bool bVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  s16 tmp [64];
  s16 local_c0 [92];
  
  pauVar6 = (undefined1 (*) [32])local_c0;
  lVar8 = 0;
  auVar9._8_2_ = 0x20;
  auVar9._0_8_ = 0x20002000200020;
  auVar9._10_2_ = 0x20;
  auVar9._12_2_ = 0x20;
  auVar9._14_2_ = 0x20;
  auVar9._16_2_ = 0x20;
  auVar9._18_2_ = 0x20;
  auVar9._20_2_ = 0x20;
  auVar9._22_2_ = 0x20;
  auVar9._24_2_ = 0x20;
  auVar9._26_2_ = 0x20;
  auVar9._28_2_ = 0x20;
  auVar9._30_2_ = 0x20;
  auVar10._8_4_ = 0xffe00020;
  auVar10._0_8_ = 0xffe00020ffe00020;
  auVar10._12_4_ = 0xffe00020;
  auVar10._16_4_ = 0xffe00020;
  auVar10._20_4_ = 0xffe00020;
  auVar10._24_4_ = 0xffe00020;
  auVar10._28_4_ = 0xffe00020;
  auVar11._8_4_ = 0x11002a;
  auVar11._0_8_ = 0x11002a0011002a;
  auVar11._12_4_ = 0x11002a;
  auVar11._16_4_ = 0x11002a;
  auVar11._20_4_ = 0x11002a;
  auVar11._24_4_ = 0x11002a;
  auVar11._28_4_ = 0x11002a;
  auVar12._8_4_ = 0xffd60011;
  auVar12._0_8_ = 0xffd60011ffd60011;
  auVar12._12_4_ = 0xffd60011;
  auVar12._16_4_ = 0xffd60011;
  auVar12._20_4_ = 0xffd60011;
  auVar12._24_4_ = 0xffd60011;
  auVar12._28_4_ = 0xffd60011;
  auVar13._8_4_ = 0x10;
  auVar13._0_8_ = 0x1000000010;
  auVar13._12_4_ = 0x10;
  auVar13._16_4_ = 0x10;
  auVar13._20_4_ = 0x10;
  auVar13._24_4_ = 0x10;
  auVar13._28_4_ = 0x10;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + lVar8),
                            *(undefined1 (*) [16])(src + lVar8 + 0x20));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + lVar8),
                            *(undefined1 (*) [16])(src + lVar8 + 0x20));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + lVar8 + 0x10),
                            *(undefined1 (*) [16])(src + lVar8 + 0x30));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + lVar8 + 0x10),
                            *(undefined1 (*) [16])(src + lVar8 + 0x30));
    auVar16._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar16._16_16_ = ZEXT116(1) * auVar1;
    auVar14 = vpmaddwd_avx2(auVar16,auVar9);
    auVar16 = vpmaddwd_avx2(auVar16,auVar10);
    auVar15._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar15._16_16_ = ZEXT116(1) * auVar2;
    auVar18 = vpmaddwd_avx2(auVar15,auVar11);
    auVar15 = vpmaddwd_avx2(auVar15,auVar12);
    auVar17 = vpor_avx2(auVar14,auVar13);
    auVar14 = vpaddd_avx2(auVar17,auVar18);
    auVar19 = vpor_avx2(auVar16,auVar13);
    auVar16 = vpaddd_avx2(auVar19,auVar15);
    auVar15 = vpsubd_avx2(auVar19,auVar15);
    auVar18 = vpsubd_avx2(auVar17,auVar18);
    auVar17 = vpsrad_avx2(auVar14,5);
    auVar19 = vpsrad_avx2(auVar16,5);
    auVar14 = vpsrad_avx2(auVar15,5);
    auVar14 = vpackssdw_avx2(auVar17,auVar14);
    auVar16 = vpsrad_avx2(auVar18,5);
    auVar16 = vpackssdw_avx2(auVar19,auVar16);
    auVar18 = vpunpcklwd_avx2(auVar14,auVar16);
    auVar14 = vpunpckhwd_avx2(auVar14,auVar16);
    auVar16 = vpunpckldq_avx2(auVar18,auVar14);
    auVar14 = vpunpckhdq_avx2(auVar18,auVar14);
    auVar18._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar16._0_16_;
    auVar18._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar14._0_16_;
    *pauVar6 = auVar18;
    auVar14 = vperm2i128_avx2(auVar16,auVar14,0x31);
    pauVar6[1] = auVar14;
    pauVar6 = pauVar6 + 2;
    lVar8 = 8;
    bVar5 = false;
  } while (bVar7);
  dct2_butterfly_h16_sse(local_c0,4,dst,4,0x14 - bit_depth,bit_depth);
  return;
}

Assistant:

void itrans_dct2_h4_w16_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[4 * 16]);
    dct2_butterfly_h4_avx2(src, tmp, 16, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h16_sse(tmp, 4, dst, 4, 20 - bit_depth, bit_depth);
}